

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::BrReg1Unsigned1
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,uint C2)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  uint uStack_20;
  bool success;
  RegSlot local_1c;
  uint C2_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_20 = C2;
  local_1c = R1;
  C2_local = labelID;
  R1_local._2_2_ = op;
  _labelID_local = this;
  CheckOpen(this);
  op_00 = R1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,BrReg1Unsigned1);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(R1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x34b,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  CheckLabel(this,C2_local);
  local_1c = ConsumeReg(this,local_1c);
  bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,R1_local._2_2_,C2_local,local_1c,uStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,R1_local._2_2_,C2_local,local_1c,uStack_20), !bVar2)) &&
     (bVar2 = TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,R1_local._2_2_,C2_local,local_1c,uStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x350,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::BrReg1Unsigned1(OpCode op, ByteCodeLabel labelID, RegSlot R1, uint C2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrReg1Unsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(BrReg1Unsigned1, op, labelID, R1, C2);
    }